

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

Gia_Man_t *
Gia_ManSweepWithBoxes
          (Gia_Man_t *p,void *pParsC,void *pParsS,int fConst,int fEquiv,int fVerbose,int fVerbEquivs
          )

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  Gia_Man_t *pGVar5;
  int nFlops;
  int nFlopsNew;
  int pFlopTypes [3];
  int *pReprs;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *pClp;
  int fVerbose_local;
  int fEquiv_local;
  int fConst_local;
  void *pParsS_local;
  void *pParsC_local;
  Gia_Man_t *p_local;
  
  memset(&nFlops,0,0xc);
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x2cd,
                  "Gia_Man_t *Gia_ManSweepWithBoxes(Gia_Man_t *, void *, void *, int, int, int, int)"
                 );
  }
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x2ce,
                  "Gia_Man_t *Gia_ManSweepWithBoxes(Gia_Man_t *, void *, void *, int, int, int, int)"
                 );
  }
  if ((pParsC == (void *)0x0) && (iVar1 = Gia_ManClockDomainNum(p), 1 < iVar1)) {
    p_local = Gia_ManSweepWithBoxesAndDomains(p,pParsS,fConst,fEquiv,fVerbose,fVerbEquivs);
  }
  else {
    pGVar4 = Gia_ManDupUnnormalize(p);
    if (pGVar4 == (Gia_Man_t *)0x0) {
      p_local = (Gia_Man_t *)0x0;
    }
    else {
      Gia_ManTransferTiming(pGVar4,p);
      uVar2 = Vec_IntCountEntry(pGVar4->vRegClasses,1);
      pGVar5 = Gia_ManDupCollapse(pGVar4,pGVar4->pAigExtra,(Vec_Int_t *)0x0,
                                  (uint)(pParsC == (void *)0x0));
      if (pParsC == (void *)0x0) {
        if (pParsS == (void *)0x0) {
          Gia_ManSeqCleanupClasses(pGVar5,fConst,fEquiv,fVerbose);
        }
        else {
          Cec_ManLSCorrespondenceClasses(pGVar5,(Cec_ParCor_t *)pParsS);
        }
      }
      else {
        Gia_ManFraigSweepPerform(pGVar5,pParsC);
      }
      pFlopTypes._4_8_ = Gia_ManFraigSelectReprs(pGVar4,pGVar5,fVerbose,&nFlops);
      Gia_ManStop(pGVar5);
      Gia_ManTransferTiming(p,pGVar4);
      pGVar5 = Gia_ManFraigReduceGia(pGVar4,(int *)pFlopTypes._4_8_);
      Gia_ManTransferTiming(pGVar5,p);
      Gia_ManStop(pGVar4);
      if (pFlopTypes._4_8_ != 0) {
        free((void *)pFlopTypes._4_8_);
        pFlopTypes[1] = 0;
        pFlopTypes[2] = 0;
      }
      pGVar4 = Gia_ManDupWithBoxes(pGVar5,(uint)(pParsC == (void *)0x0));
      Gia_ManStop(pGVar5);
      uVar3 = Vec_IntCountEntry(pGVar4->vRegClasses,1);
      pFlopTypes[0] = (uVar2 - uVar3) - (nFlops + nFlopsNew);
      if (fVerbEquivs != 0) {
        printf("Domain %2d : %5d -> %5d :  ",1,(ulong)uVar2,(ulong)uVar3);
        uVar2 = Abc_MaxInt(0,pFlopTypes[0]);
        uVar3 = Abc_MaxInt(0,-pFlopTypes[0]);
        printf("EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n",(ulong)(uint)nFlops,
               (ulong)(uint)nFlopsNew,(ulong)uVar2,(ulong)uVar3);
      }
      p_local = Gia_ManDupNormalize(pGVar4);
      Gia_ManTransferTiming(p_local,pGVar4);
      Gia_ManStop(pGVar4);
    }
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManSweepWithBoxes( Gia_Man_t * p, void * pParsC, void * pParsS, int fConst, int fEquiv, int fVerbose, int fVerbEquivs )
{ 
    Gia_Man_t * pClp, * pNew, * pTemp;
    int * pReprs, pFlopTypes[3] = {0};
    int nFlopsNew, nFlops;
    assert( Gia_ManRegNum(p) == 0 );
    assert( p->pAigExtra != NULL );
    // consider seq synthesis with multiple clock domains
    if ( pParsC == NULL && Gia_ManClockDomainNum(p) > 1 )
        return Gia_ManSweepWithBoxesAndDomains( p, pParsS, fConst, fEquiv, fVerbose, fVerbEquivs );
    // order AIG objects
    pNew = Gia_ManDupUnnormalize( p );
    if ( pNew == NULL )
        return NULL;
    Gia_ManTransferTiming( pNew, p );
    nFlops = Vec_IntCountEntry(pNew->vRegClasses, 1);
    // find global equivalences
    pClp = Gia_ManDupCollapse( pNew, pNew->pAigExtra, NULL, pParsC ? 0 : 1 );
    // compute equivalences
    if ( pParsC )
        Gia_ManFraigSweepPerform( pClp, pParsC );
    else if ( pParsS )
        Cec_ManLSCorrespondenceClasses( pClp, (Cec_ParCor_t *)pParsS );
    else 
        Gia_ManSeqCleanupClasses( pClp, fConst, fEquiv, fVerbose );
    // transfer equivalences
    pReprs = Gia_ManFraigSelectReprs( pNew, pClp, fVerbose, pFlopTypes );
    Gia_ManStop( pClp );
    // reduce AIG
    Gia_ManTransferTiming( p, pNew );
    pNew = Gia_ManFraigReduceGia( pTemp = pNew, pReprs );
    Gia_ManTransferTiming( pNew, p );
    Gia_ManStop( pTemp );
    ABC_FREE( pReprs );
    // derive new AIG
    pNew = Gia_ManDupWithBoxes( pTemp = pNew, pParsC ? 0 : 1 );
    Gia_ManStop( pTemp );
    // report
    nFlopsNew = Vec_IntCountEntry(pNew->vRegClasses, 1);
    pFlopTypes[2] = nFlops - nFlopsNew - (pFlopTypes[0] + pFlopTypes[1]);
    if ( fVerbEquivs )
    {
        printf( "Domain %2d : %5d -> %5d :  ", 1, nFlops, nFlopsNew );
        printf( "EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n", 
            pFlopTypes[0], pFlopTypes[1], Abc_MaxInt(0, pFlopTypes[2]), Abc_MaxInt(0, -pFlopTypes[2]) );
    }
    // normalize the result
    pNew = Gia_ManDupNormalize( pTemp = pNew );
    Gia_ManTransferTiming( pNew, pTemp );
    Gia_ManStop( pTemp );
    // check integrity
    //Gia_ManCheckIntegrityWithBoxes( pNew );
    return pNew;
}